

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pack.cpp
# Opt level: O1

void cli::anon_unknown_1::addDirectory(ArchiveBuilder *archive,string *path,bool recursive)

{
  pointer pcVar1;
  int iVar2;
  DIR *__dirp;
  dirent *pdVar3;
  long *plVar4;
  size_type *psVar5;
  undefined7 in_register_00000011;
  __string_type __str;
  long *local_80;
  ulong local_78;
  long local_70 [2];
  string local_60;
  undefined4 local_3c;
  ArchiveBuilder *local_38;
  
  local_3c = (undefined4)CONCAT71(in_register_00000011,recursive);
  local_38 = archive;
  __dirp = opendir((path->_M_dataplus)._M_p);
  if (__dirp != (DIR *)0x0) {
    pdVar3 = readdir(__dirp);
    if (pdVar3 != (dirent *)0x0) {
      do {
        iVar2 = strcmp(pdVar3->d_name,".");
        if (iVar2 != 0) {
          iVar2 = strcmp(pdVar3->d_name,"..");
          if (iVar2 != 0) {
            if (pdVar3->d_type == '\x04') {
              if ((char)local_3c == '\0') goto LAB_001085b9;
              local_80 = local_70;
              pcVar1 = (path->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_80,pcVar1,pcVar1 + path->_M_string_length);
              std::__cxx11::string::_M_replace_aux((ulong)&local_80,local_78,0,'\x01');
              plVar4 = (long *)std::__cxx11::string::append((char *)&local_80);
              local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
              psVar5 = (size_type *)(plVar4 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar4 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar5) {
                local_60.field_2._M_allocated_capacity = *psVar5;
                local_60.field_2._8_8_ = plVar4[3];
              }
              else {
                local_60.field_2._M_allocated_capacity = *psVar5;
                local_60._M_dataplus._M_p = (pointer)*plVar4;
              }
              local_60._M_string_length = plVar4[1];
              *plVar4 = (long)psVar5;
              plVar4[1] = 0;
              *(undefined1 *)(plVar4 + 2) = 0;
              addDirectory(local_38,&local_60,true);
            }
            else {
              local_80 = local_70;
              pcVar1 = (path->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_80,pcVar1,pcVar1 + path->_M_string_length);
              std::__cxx11::string::_M_replace_aux((ulong)&local_80,local_78,0,'\x01');
              plVar4 = (long *)std::__cxx11::string::append((char *)&local_80);
              psVar5 = (size_type *)(plVar4 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar4 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar5) {
                local_60.field_2._M_allocated_capacity = *psVar5;
                local_60.field_2._8_8_ = plVar4[3];
                local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
              }
              else {
                local_60.field_2._M_allocated_capacity = *psVar5;
                local_60._M_dataplus._M_p = (pointer)*plVar4;
              }
              local_60._M_string_length = plVar4[1];
              *plVar4 = (long)psVar5;
              plVar4[1] = 0;
              *(undefined1 *)(plVar4 + 2) = 0;
              ZAP::ArchiveBuilder::addFile(local_38,&local_60,&local_60);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_60._M_dataplus._M_p != &local_60.field_2) {
              operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
            }
            if (local_80 != local_70) {
              operator_delete(local_80,local_70[0] + 1);
            }
          }
        }
LAB_001085b9:
        pdVar3 = readdir(__dirp);
      } while (pdVar3 != (dirent *)0x0);
    }
    closedir(__dirp);
  }
  return;
}

Assistant:

void addDirectory(ZAP::ArchiveBuilder &archive, const std::string &path, bool recursive)
		{
		#ifdef _WIN32
			HANDLE dir;
			WIN32_FIND_DATAA ent;

			if ((dir = FindFirstFileA((path + "/*").c_str(), &ent)) != INVALID_HANDLE_VALUE)
			{
				do
				{
					if ((std::strcmp(ent.cFileName, ".") == 0) || (std::strcmp(ent.cFileName, "..") == 0))
						continue;

					if (ent.dwFileAttributes & FILE_ATTRIBUTE_DIRECTORY)
					{
						if (recursive)
							addDirectory(archive, path + '/' + ent.cFileName, recursive);
					}
					else
					{
						addPath(archive, path + '/' + ent.cFileName);
					}
				} while (FindNextFileA(dir, &ent));

				FindClose(dir);
			}
		#else
			DIR *dir;
			struct dirent *ent;

			if ((dir = opendir(path.c_str())) != nullptr)
			{
				while ((ent = readdir(dir)) != nullptr)
				{
					if ((std::strcmp(ent->d_name, ".") == 0) || (std::strcmp(ent->d_name, "..") == 0))
						continue;

					if (ent->d_type == DT_DIR)
					{
						if (recursive)
							addDirectory(archive, path + '/' + ent->d_name, recursive);
					}
					else
					{
						addPath(archive, path + '/' + ent->d_name);
					}
				}

				closedir(dir);
			}
		#endif
		}